

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall crnlib::symbol_codec::decode_golomb(symbol_codec *this,uint m)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint q;
  int iVar6;
  bool bVar7;
  
  iVar6 = 0;
  do {
    uVar2 = decode_peek_bits(this,0x10);
    uVar3 = ~uVar2 & 0xffff;
    bVar7 = uVar3 < 0x100;
    uVar5 = uVar3 >> 8;
    if (bVar7) {
      uVar5 = uVar3;
    }
    iVar1 = (uint)bVar7 * 8 + 4;
    uVar3 = uVar5 >> 4;
    if (uVar5 < 0x10) {
      iVar1 = (uint)bVar7 * 8 + 8;
      uVar3 = uVar5;
    }
    iVar4 = iVar1 + -2;
    uVar5 = uVar3 >> 2;
    if (uVar3 < 4) {
      iVar4 = iVar1;
      uVar5 = uVar3;
    }
    uVar5 = (iVar4 - (uint)(1 < uVar5)) - (uint)((uVar5 >> (uint)(1 < uVar5) & 1) != 0);
    iVar6 = iVar6 + uVar5;
  } while (0xf < uVar5);
  decode_remove_bits(this,iVar6 + 1);
  uVar2 = decode_truncated_binary(this,m);
  return uVar2 + iVar6 * m;
}

Assistant:

uint symbol_codec::decode_golomb(uint m) {
  CRNLIB_ASSERT(m > 1);

  uint q = 0;

  for (;;) {
    uint k = decode_peek_bits(16);

    uint l = utils::count_leading_zeros16((~k) & 0xFFFF);
    q += l;
    if (l < 16)
      break;
  }

  decode_remove_bits(q + 1);

  uint r = decode_truncated_binary(m);

  return (q * m) + r;
}